

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_pstring.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  int iVar2;
  basic_string_view<char,_std::char_traits<char>_> bVar3;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> bVar4;
  basic_pstring<char> local_4c0;
  undefined4 local_4b4;
  size_t local_4b0;
  undefined4 local_4a4;
  size_t local_4a0 [2];
  basic_pstring<char> local_490;
  pstring ps2_1;
  size_t local_480;
  allocator<char> local_471;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_470;
  basic_pstring<char> local_450;
  pstring ps1_1;
  basic_pstring<char> local_440;
  undefined4 local_434;
  size_t local_430;
  undefined4 local_424;
  size_t local_420 [2];
  basic_pstring<char> local_410;
  pstring ps2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_400;
  basic_pstring<char> local_3e0;
  pstring ps1;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_3b8;
  basic_pstring<wchar_t> local_398;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_390;
  basic_pstring<wchar_t> local_370;
  undefined4 local_364;
  size_t local_360;
  allocator<wchar_t> local_351;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_350;
  basic_pstring<wchar_t> local_330;
  wpstring wps_2;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_308;
  basic_pstring<wchar_t> local_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  basic_pstring<wchar_t> local_2c0;
  undefined4 local_2b4;
  size_t local_2b0;
  allocator<char> local_2a1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  basic_pstring<wchar_t> local_280;
  wpstring wps_1;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_258;
  basic_pstring<char> local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  basic_pstring<char> local_210;
  undefined4 local_204;
  size_t local_200;
  allocator<wchar_t> local_1f1;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_1f0;
  basic_pstring<char> local_1d0;
  pstring ps_2;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_1a8;
  basic_pstring<char> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_pstring<char> local_160;
  undefined4 local_154;
  size_t local_150;
  allocator<char> local_141;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_pstring<char> local_120;
  pstring ps_1;
  basic_pstring<wchar_t> local_f8;
  basic_pstring<wchar_t> local_f0;
  wpstring wps;
  basic_pstring<char> local_c8 [3];
  basic_pstring<char> local_b0;
  pstring ps;
  basic_pstring_view_impl<char,_4UL> local_a0;
  pstring_array<4UL> narrow_1;
  array<char,_4UL> arr_1;
  undefined1 auStack_88 [8];
  wpstring_array<4UL> wide_1;
  array<wchar_t,_4UL> arr;
  basic_pstring_view_impl<char,_7UL> local_50;
  pstring_view<8UL> narrow;
  size_type local_40 [2];
  undefined1 auStack_38 [8];
  wpstring_view<8UL> wide;
  
  builtin_wcsncpy(wide.super_basic_pstring_view_impl<wchar_t,_7UL>.data_ + 2,L"eral",4);
  auStack_38._0_4_ = L'\a';
  auStack_38._4_4_ = L'L';
  wide.super_basic_pstring_view_impl<wchar_t,_7UL>.data_[0] = L'i';
  wide.super_basic_pstring_view_impl<wchar_t,_7UL>.data_[1] = L't';
  boost::detail::test_impl
            ("std::wstring_view(wide) == L\"Literal\"",
             "/workspace/llm4binary/github/license_all_cmakelists_25/jbuonagurio[P]libxll/test/test_pstring.cpp"
             ,0x17,"int main()",true);
  local_40[0] = xll::detail::basic_pstring_view_impl<wchar_t,_7UL>::size
                          ((basic_pstring_view_impl<wchar_t,_7UL> *)auStack_38);
  narrow.super_basic_pstring_view_impl<char,_7UL>.data_[4] = '\a';
  narrow.super_basic_pstring_view_impl<char,_7UL>.data_[5] = '\0';
  narrow.super_basic_pstring_view_impl<char,_7UL>.data_[6] = '\0';
  narrow.super_basic_pstring_view_impl<char,_7UL>.data_[7] = '\0';
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_int,int>
            ("wide.size()","7",
             "/workspace/llm4binary/github/license_all_cmakelists_25/jbuonagurio[P]libxll/test/test_pstring.cpp"
             ,0x18,"int main()",local_40,narrow.super_basic_pstring_view_impl<char,_7UL>.data_ + 4);
  builtin_strncpy(local_50.data_,"\aLiteral",8);
  boost::detail::test_impl
            ("std::string_view(narrow) == \"Literal\"",
             "/workspace/llm4binary/github/license_all_cmakelists_25/jbuonagurio[P]libxll/test/test_pstring.cpp"
             ,0x1d,"int main()",true);
  arr._M_elems[3]._2_1_ = xll::detail::basic_pstring_view_impl<char,_7UL>::size(&local_50);
  arr._M_elems[2] = L'\a';
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_char,int>
            ("narrow.size()","7",
             "/workspace/llm4binary/github/license_all_cmakelists_25/jbuonagurio[P]libxll/test/test_pstring.cpp"
             ,0x1e,"int main()",(undefined1 *)((long)arr._M_elems + 0xe),arr._M_elems + 2);
  arr._M_elems[0] = L'S';
  arr._M_elems[1] = L'T';
  auStack_88._0_4_ = L'\x04';
  auStack_88._4_4_ = L'T';
  wide_1.super_basic_pstring_view_impl<wchar_t,_4UL>.data_[0] = L'E';
  wide_1.super_basic_pstring_view_impl<wchar_t,_4UL>.data_[1] = L'S';
  wide_1.super_basic_pstring_view_impl<wchar_t,_4UL>.data_[2] = L'T';
  boost::detail::test_impl
            ("std::wstring_view(wide) == L\"TEST\"",
             "/workspace/llm4binary/github/license_all_cmakelists_25/jbuonagurio[P]libxll/test/test_pstring.cpp"
             ,0x24,"int main()",true);
  arr_1._M_elems =
       (_Type)xll::detail::basic_pstring_view_impl<wchar_t,_4UL>::size
                        ((basic_pstring_view_impl<wchar_t,_4UL> *)auStack_88);
  stack0xffffffffffffff6c = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_int,int>
            ("wide.size()","4",
             "/workspace/llm4binary/github/license_all_cmakelists_25/jbuonagurio[P]libxll/test/test_pstring.cpp"
             ,0x25,"int main()",&arr_1,narrow_1.super_basic_pstring_view_impl<char,_4UL>.data_ + 4);
  narrow_1.super_basic_pstring_view_impl<char,_4UL>.data_[0] = 'T';
  narrow_1.super_basic_pstring_view_impl<char,_4UL>.data_[1] = 'E';
  narrow_1.super_basic_pstring_view_impl<char,_4UL>.data_[2] = 'S';
  narrow_1.super_basic_pstring_view_impl<char,_4UL>.data_[3] = 'T';
  builtin_strncpy(local_a0.data_,"\x04TEST",5);
  boost::detail::test_impl
            ("std::string_view(narrow) == \"TEST\"",
             "/workspace/llm4binary/github/license_all_cmakelists_25/jbuonagurio[P]libxll/test/test_pstring.cpp"
             ,0x2b,"int main()",true);
  ps.data_._6_1_ = xll::detail::basic_pstring_view_impl<char,_4UL>::size(&local_a0);
  ps.data_._0_4_ = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_char,int>
            ("narrow.size()","4",
             "/workspace/llm4binary/github/license_all_cmakelists_25/jbuonagurio[P]libxll/test/test_pstring.cpp"
             ,0x2c,"int main()",(undefined1 *)((long)&ps.data_ + 6),&ps);
  xll::literals::pstring_literals::operator____ps((pstring_literals *)&local_b0,"Test",4);
  boost::detail::test_trait_impl<std::is_same<xll::basic_pstring<char>,xll::basic_pstring<char>>>
            ("(std::is_same<decltype(ps), pstring>)",
             (_func_void_is_same<xll::basic_pstring<char>,_xll::basic_pstring<char>_> *)0x0,true,
             "/workspace/llm4binary/github/license_all_cmakelists_25/jbuonagurio[P]libxll/test/test_pstring.cpp"
             ,0x32,"int main()");
  s_abi_cxx11_((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&wps,"Test",4);
  xll::basic_pstring<char>::basic_pstring
            (local_c8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&wps);
  bVar1 = xll::operator==(&local_b0,local_c8);
  boost::detail::test_impl
            ("ps == \"Test\"s",
             "/workspace/llm4binary/github/license_all_cmakelists_25/jbuonagurio[P]libxll/test/test_pstring.cpp"
             ,0x33,"int main()",bVar1);
  xll::basic_pstring<char>::~basic_pstring(local_c8);
  std::__cxx11::string::~string((string *)&wps);
  xll::basic_pstring<char>::~basic_pstring(&local_b0);
  xll::literals::pstring_literals::operator____ps((pstring_literals *)&local_f0,L"Test",4);
  boost::detail::
  test_trait_impl<std::is_same<xll::basic_pstring<wchar_t>,xll::basic_pstring<wchar_t>>>
            ("(std::is_same<decltype(wps), wpstring>)",
             (_func_void_is_same<xll::basic_pstring<wchar_t>,_xll::basic_pstring<wchar_t>_> *)0x0,
             true,
             "/workspace/llm4binary/github/license_all_cmakelists_25/jbuonagurio[P]libxll/test/test_pstring.cpp"
             ,0x39,"int main()");
  s_abi_cxx11_((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)&ps_1,
               L"Test",4);
  xll::basic_pstring<wchar_t>::basic_pstring
            (&local_f8,
             (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)&ps_1);
  bVar1 = xll::operator==(&local_f0,&local_f8);
  boost::detail::test_impl
            ("wps == L\"Test\"s",
             "/workspace/llm4binary/github/license_all_cmakelists_25/jbuonagurio[P]libxll/test/test_pstring.cpp"
             ,0x3a,"int main()",bVar1);
  xll::basic_pstring<wchar_t>::~basic_pstring(&local_f8);
  std::__cxx11::wstring::~wstring((wstring *)&ps_1);
  xll::basic_pstring<wchar_t>::~basic_pstring(&local_f0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_140,"Test",&local_141);
  xll::basic_pstring<char>::basic_pstring(&local_120,&local_140);
  std::__cxx11::string::~string((string *)&local_140);
  std::allocator<char>::~allocator(&local_141);
  local_150 = xll::basic_pstring<char>::size(&local_120);
  local_154 = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("ps.size()","4",
             "/workspace/llm4binary/github/license_all_cmakelists_25/jbuonagurio[P]libxll/test/test_pstring.cpp"
             ,0x3f,"int main()",&local_150,&local_154);
  s_abi_cxx11_(&local_180,"Test",4);
  xll::basic_pstring<char>::basic_pstring(&local_160,&local_180);
  bVar1 = xll::operator==(&local_120,&local_160);
  boost::detail::test_impl
            ("ps == \"Test\"s",
             "/workspace/llm4binary/github/license_all_cmakelists_25/jbuonagurio[P]libxll/test/test_pstring.cpp"
             ,0x40,"int main()",bVar1);
  xll::basic_pstring<char>::~basic_pstring(&local_160);
  std::__cxx11::string::~string((string *)&local_180);
  s_abi_cxx11_(&local_1a8,L"Test",4);
  xll::basic_pstring<char>::basic_pstring<wchar_t,_nullptr>(&local_188,&local_1a8);
  bVar1 = xll::operator==(&local_120,&local_188);
  boost::detail::test_impl
            ("ps == L\"Test\"s",
             "/workspace/llm4binary/github/license_all_cmakelists_25/jbuonagurio[P]libxll/test/test_pstring.cpp"
             ,0x41,"int main()",bVar1);
  xll::basic_pstring<char>::~basic_pstring(&local_188);
  std::__cxx11::wstring::~wstring((wstring *)&local_1a8);
  bVar3 = xll::basic_pstring::operator_cast_to_basic_string_view((basic_pstring *)&local_120);
  _ps_2 = sv("Test",4);
  bVar1 = std::operator==(bVar3,_ps_2);
  boost::detail::test_impl
            ("ps == \"Test\"sv",
             "/workspace/llm4binary/github/license_all_cmakelists_25/jbuonagurio[P]libxll/test/test_pstring.cpp"
             ,0x42,"int main()",bVar1);
  xll::basic_pstring<char>::~basic_pstring(&local_120);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>((wstring *)&local_1f0,L"Test",&local_1f1);
  xll::basic_pstring<char>::basic_pstring<wchar_t,_nullptr>(&local_1d0,&local_1f0);
  std::__cxx11::wstring::~wstring((wstring *)&local_1f0);
  std::allocator<wchar_t>::~allocator(&local_1f1);
  local_200 = xll::basic_pstring<char>::size(&local_1d0);
  local_204 = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("ps.size()","4",
             "/workspace/llm4binary/github/license_all_cmakelists_25/jbuonagurio[P]libxll/test/test_pstring.cpp"
             ,0x47,"int main()",&local_200,&local_204);
  s_abi_cxx11_(&local_230,"Test",4);
  xll::basic_pstring<char>::basic_pstring(&local_210,&local_230);
  bVar1 = xll::operator==(&local_1d0,&local_210);
  boost::detail::test_impl
            ("ps == \"Test\"s",
             "/workspace/llm4binary/github/license_all_cmakelists_25/jbuonagurio[P]libxll/test/test_pstring.cpp"
             ,0x48,"int main()",bVar1);
  xll::basic_pstring<char>::~basic_pstring(&local_210);
  std::__cxx11::string::~string((string *)&local_230);
  s_abi_cxx11_(&local_258,L"Test",4);
  xll::basic_pstring<char>::basic_pstring<wchar_t,_nullptr>(&local_238,&local_258);
  bVar1 = xll::operator==(&local_1d0,&local_238);
  boost::detail::test_impl
            ("ps == L\"Test\"s",
             "/workspace/llm4binary/github/license_all_cmakelists_25/jbuonagurio[P]libxll/test/test_pstring.cpp"
             ,0x49,"int main()",bVar1);
  xll::basic_pstring<char>::~basic_pstring(&local_238);
  std::__cxx11::wstring::~wstring((wstring *)&local_258);
  bVar3 = xll::basic_pstring::operator_cast_to_basic_string_view((basic_pstring *)&local_1d0);
  _wps_1 = sv("Test",4);
  bVar1 = std::operator==(bVar3,_wps_1);
  boost::detail::test_impl
            ("ps == \"Test\"sv",
             "/workspace/llm4binary/github/license_all_cmakelists_25/jbuonagurio[P]libxll/test/test_pstring.cpp"
             ,0x4a,"int main()",bVar1);
  xll::basic_pstring<char>::~basic_pstring(&local_1d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a0,"Test",&local_2a1);
  xll::basic_pstring<wchar_t>::basic_pstring<char,_nullptr>(&local_280,&local_2a0);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::allocator<char>::~allocator(&local_2a1);
  local_2b0 = xll::basic_pstring<wchar_t>::size(&local_280);
  local_2b4 = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("wps.size()","4",
             "/workspace/llm4binary/github/license_all_cmakelists_25/jbuonagurio[P]libxll/test/test_pstring.cpp"
             ,0x4f,"int main()",&local_2b0,&local_2b4);
  s_abi_cxx11_(&local_2e0,"Test",4);
  xll::basic_pstring<wchar_t>::basic_pstring<char,_nullptr>(&local_2c0,&local_2e0);
  bVar1 = xll::operator==(&local_280,&local_2c0);
  boost::detail::test_impl
            ("wps == \"Test\"s",
             "/workspace/llm4binary/github/license_all_cmakelists_25/jbuonagurio[P]libxll/test/test_pstring.cpp"
             ,0x50,"int main()",bVar1);
  xll::basic_pstring<wchar_t>::~basic_pstring(&local_2c0);
  std::__cxx11::string::~string((string *)&local_2e0);
  s_abi_cxx11_(&local_308,L"Test",4);
  xll::basic_pstring<wchar_t>::basic_pstring(&local_2e8,&local_308);
  bVar1 = xll::operator==(&local_280,&local_2e8);
  boost::detail::test_impl
            ("wps == L\"Test\"s",
             "/workspace/llm4binary/github/license_all_cmakelists_25/jbuonagurio[P]libxll/test/test_pstring.cpp"
             ,0x51,"int main()",bVar1);
  xll::basic_pstring<wchar_t>::~basic_pstring(&local_2e8);
  std::__cxx11::wstring::~wstring((wstring *)&local_308);
  bVar4 = xll::basic_pstring::operator_cast_to_basic_string_view((basic_pstring *)&local_280);
  _wps_2 = sv(L"Test",4);
  bVar1 = std::operator==(bVar4,_wps_2);
  boost::detail::test_impl
            ("wps == L\"Test\"sv",
             "/workspace/llm4binary/github/license_all_cmakelists_25/jbuonagurio[P]libxll/test/test_pstring.cpp"
             ,0x52,"int main()",bVar1);
  xll::basic_pstring<wchar_t>::~basic_pstring(&local_280);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>((wstring *)&local_350,L"Test",&local_351);
  xll::basic_pstring<wchar_t>::basic_pstring(&local_330,&local_350);
  std::__cxx11::wstring::~wstring((wstring *)&local_350);
  std::allocator<wchar_t>::~allocator(&local_351);
  local_360 = xll::basic_pstring<wchar_t>::size(&local_330);
  local_364 = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("wps.size()","4",
             "/workspace/llm4binary/github/license_all_cmakelists_25/jbuonagurio[P]libxll/test/test_pstring.cpp"
             ,0x57,"int main()",&local_360,&local_364);
  s_abi_cxx11_(&local_390,"Test",4);
  xll::basic_pstring<wchar_t>::basic_pstring<char,_nullptr>(&local_370,&local_390);
  bVar1 = xll::operator==(&local_330,&local_370);
  boost::detail::test_impl
            ("wps == \"Test\"s",
             "/workspace/llm4binary/github/license_all_cmakelists_25/jbuonagurio[P]libxll/test/test_pstring.cpp"
             ,0x58,"int main()",bVar1);
  xll::basic_pstring<wchar_t>::~basic_pstring(&local_370);
  std::__cxx11::string::~string((string *)&local_390);
  s_abi_cxx11_(&local_3b8,L"Test",4);
  xll::basic_pstring<wchar_t>::basic_pstring(&local_398,&local_3b8);
  bVar1 = xll::operator==(&local_330,&local_398);
  boost::detail::test_impl
            ("wps == L\"Test\"s",
             "/workspace/llm4binary/github/license_all_cmakelists_25/jbuonagurio[P]libxll/test/test_pstring.cpp"
             ,0x59,"int main()",bVar1);
  xll::basic_pstring<wchar_t>::~basic_pstring(&local_398);
  std::__cxx11::wstring::~wstring((wstring *)&local_3b8);
  bVar4 = xll::basic_pstring::operator_cast_to_basic_string_view((basic_pstring *)&local_330);
  _ps1 = sv(L"Test",4);
  bVar1 = std::operator==(bVar4,_ps1);
  boost::detail::test_impl
            ("wps == L\"Test\"sv",
             "/workspace/llm4binary/github/license_all_cmakelists_25/jbuonagurio[P]libxll/test/test_pstring.cpp"
             ,0x5a,"int main()",bVar1);
  xll::basic_pstring<wchar_t>::~basic_pstring(&local_330);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_400,"Copy",(allocator<char> *)((long)&ps2.data_ + 7));
  xll::basic_pstring<char>::basic_pstring(&local_3e0,&local_400);
  std::__cxx11::string::~string((string *)&local_400);
  std::allocator<char>::~allocator((allocator<char> *)((long)&ps2.data_ + 7));
  xll::basic_pstring<char>::basic_pstring(&local_410,&local_3e0);
  local_420[0] = xll::basic_pstring<char>::size(&local_3e0);
  local_424 = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("ps1.size()","4",
             "/workspace/llm4binary/github/license_all_cmakelists_25/jbuonagurio[P]libxll/test/test_pstring.cpp"
             ,0x60,"int main()",local_420,&local_424);
  local_430 = xll::basic_pstring<char>::size(&local_410);
  local_434 = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("ps2.size()","4",
             "/workspace/llm4binary/github/license_all_cmakelists_25/jbuonagurio[P]libxll/test/test_pstring.cpp"
             ,0x61,"int main()",&local_430,&local_434);
  xll::basic_pstring<char>::basic_pstring(&local_440,"Copy");
  bVar1 = xll::operator==(&local_3e0,&local_440);
  boost::detail::test_impl
            ("ps1 == \"Copy\"",
             "/workspace/llm4binary/github/license_all_cmakelists_25/jbuonagurio[P]libxll/test/test_pstring.cpp"
             ,0x62,"int main()",bVar1);
  xll::basic_pstring<char>::~basic_pstring(&local_440);
  xll::basic_pstring<char>::basic_pstring(&ps1_1,"Copy");
  bVar1 = xll::operator==(&local_410,&ps1_1);
  boost::detail::test_impl
            ("ps2 == \"Copy\"",
             "/workspace/llm4binary/github/license_all_cmakelists_25/jbuonagurio[P]libxll/test/test_pstring.cpp"
             ,99,"int main()",bVar1);
  xll::basic_pstring<char>::~basic_pstring(&ps1_1);
  xll::basic_pstring<char>::~basic_pstring(&local_410);
  xll::basic_pstring<char>::~basic_pstring(&local_3e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_470,"Move",&local_471);
  xll::basic_pstring<char>::basic_pstring(&local_450,&local_470);
  std::__cxx11::string::~string((string *)&local_470);
  std::allocator<char>::~allocator(&local_471);
  local_480 = xll::basic_pstring<char>::size(&local_450);
  ps2_1.data_._4_4_ = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("ps1.size()","4",
             "/workspace/llm4binary/github/license_all_cmakelists_25/jbuonagurio[P]libxll/test/test_pstring.cpp"
             ,0x68,"int main()",&local_480,(undefined1 *)((long)&ps2_1.data_ + 4));
  xll::basic_pstring<char>::basic_pstring(&local_490,&local_450);
  local_4a0[0] = xll::basic_pstring<char>::size(&local_450);
  local_4a4 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("ps1.size()","0",
             "/workspace/llm4binary/github/license_all_cmakelists_25/jbuonagurio[P]libxll/test/test_pstring.cpp"
             ,0x6a,"int main()",local_4a0,&local_4a4);
  local_4b0 = xll::basic_pstring<char>::size(&local_490);
  local_4b4 = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("ps2.size()","4",
             "/workspace/llm4binary/github/license_all_cmakelists_25/jbuonagurio[P]libxll/test/test_pstring.cpp"
             ,0x6b,"int main()",&local_4b0,&local_4b4);
  xll::basic_pstring<char>::basic_pstring(&local_4c0,"Move");
  bVar1 = xll::operator==(&local_490,&local_4c0);
  boost::detail::test_impl
            ("ps2 == \"Move\"",
             "/workspace/llm4binary/github/license_all_cmakelists_25/jbuonagurio[P]libxll/test/test_pstring.cpp"
             ,0x6c,"int main()",bVar1);
  xll::basic_pstring<char>::~basic_pstring(&local_4c0);
  xll::basic_pstring<char>::~basic_pstring(&local_490);
  xll::basic_pstring<char>::~basic_pstring(&local_450);
  iVar2 = boost::report_errors();
  return iVar2;
}

Assistant:

int main()
{
    using namespace std::string_literals;
    using namespace std::string_view_literals;

    {
        // compile-time wide pstring view
        constexpr auto wide = make_wpstring_view(L"Literal");
        BOOST_TEST(std::wstring_view(wide) == L"Literal");
        BOOST_TEST_EQ(wide.size(), 7);
    }
    {
        // compile-time narrow pstring view
        constexpr auto narrow = make_pstring_view("Literal");
        BOOST_TEST(std::string_view(narrow) == "Literal");
        BOOST_TEST_EQ(narrow.size(), 7);
    }
    {
        // compile-time wide pstring array
        constexpr std::array<wchar_t, 4> arr {{ L'T', L'E', L'S', L'T' }};
        constexpr auto wide = make_wpstring_array(arr);
        BOOST_TEST(std::wstring_view(wide) == L"TEST");
        BOOST_TEST_EQ(wide.size(), 4);
    }
    {
        // compile-time narrow pstring array
        constexpr std::array<char, 4> arr {{ 'T', 'E', 'S', 'T' }};
        constexpr auto narrow = make_pstring_array(arr);
        BOOST_TEST(std::string_view(narrow) == "TEST");
        BOOST_TEST_EQ(narrow.size(), 4);
    }
    {
        // narrow pstring literals
        using namespace xll::pstring_literals;
        auto ps = "Test"_ps;
        BOOST_TEST_TRAIT_TRUE((std::is_same<decltype(ps), pstring>));
        BOOST_TEST(ps == "Test"s);
    }
    {
        // wide pstring literals
        using namespace xll::pstring_literals;
        auto wps = L"Test"_ps;
        BOOST_TEST_TRAIT_TRUE((std::is_same<decltype(wps), wpstring>));
        BOOST_TEST(wps == L"Test"s);
    }
    {
        // narrow pstring with no conversion
        pstring ps(std::string("Test"));
        BOOST_TEST_EQ(ps.size(), 4);
        BOOST_TEST(ps == "Test"s);
        BOOST_TEST(ps == L"Test"s);
        BOOST_TEST(ps == "Test"sv);
    }
    {
        // narrow pstring with UTF-16 to UTF-8 conversion
        pstring ps(std::wstring(L"Test"));
        BOOST_TEST_EQ(ps.size(), 4);
        BOOST_TEST(ps == "Test"s);
        BOOST_TEST(ps == L"Test"s);
        BOOST_TEST(ps == "Test"sv);
    }
    {
        // wide pstring with UTF-8 to UTF-16 conversion
        wpstring wps(std::string("Test"));
        BOOST_TEST_EQ(wps.size(), 4);
        BOOST_TEST(wps == "Test"s);
        BOOST_TEST(wps == L"Test"s);
        BOOST_TEST(wps == L"Test"sv);
    }
    {
        // wide pstring with no conversion
        wpstring wps(std::wstring(L"Test"));
        BOOST_TEST_EQ(wps.size(), 4);
        BOOST_TEST(wps == "Test"s);
        BOOST_TEST(wps == L"Test"s);
        BOOST_TEST(wps == L"Test"sv);
    }
    {
        // copy construct
        pstring ps1(std::string("Copy"));
        pstring ps2(ps1);
        BOOST_TEST_EQ(ps1.size(), 4);
        BOOST_TEST_EQ(ps2.size(), 4);
        BOOST_TEST(ps1 == "Copy");
        BOOST_TEST(ps2 == "Copy");
    }
    {
        // move construct
        pstring ps1(std::string("Move"));
        BOOST_TEST_EQ(ps1.size(), 4);
        pstring ps2(std::move(ps1));
        BOOST_TEST_EQ(ps1.size(), 0);
        BOOST_TEST_EQ(ps2.size(), 4);
        BOOST_TEST(ps2 == "Move");
    }

    return boost::report_errors();
}